

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void scale_mappos_down(mappos16_t *in,mappos8_t *out)

{
  long lVar1;
  uint8_t *pcoordout;
  uint16_t *pcoordin;
  
  lVar1 = 0;
  do {
    (&out->u)[lVar1] = (uint8_t)((&in->u)[lVar1] + 4 >> 3);
    lVar1 = lVar1 + 1;
  } while ((char)lVar1 != '\x03');
  return;
}

Assistant:

void scale_mappos_down(const mappos16_t *in, mappos8_t *out)
{
  const uint16_t *pcoordin;  /* was HL */
  uint8_t        *pcoordout; /* was DE */
  uint8_t         iters;     /* was B */

  assert(in  != NULL);
  assert(out != NULL);

  /* Use knowledge of the structure layout to cast the pointers to array[3]
   * of their respective types. */
  pcoordin  = (const uint16_t *) &in->u;
  pcoordout = (uint8_t *) &out->u;

  iters = 3;
  do
    *pcoordout++ = divround(*pcoordin++);
  while (--iters);
}